

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O2

void __thiscall SQASTWritingVisitor::visitFunctionDecl(SQASTWritingVisitor *this,FunctionDecl *f)

{
  uint uVar1;
  ParamDecl **ppPVar2;
  long lVar3;
  
  writeNodeHeader(this,(Node *)f);
  writeString(this,f->_name);
  OutputStream::writeVaruint(this->stream,(ulong)(f->_parameters)._size);
  ppPVar2 = (f->_parameters)._vals;
  uVar1 = (f->_parameters)._size;
  for (lVar3 = 0; (ulong)uVar1 << 3 != lVar3; lVar3 = lVar3 + 8) {
    SQCompilation::Node::visit<SQASTWritingVisitor>(*(Node **)((long)ppPVar2 + lVar3),this);
  }
  SQCompilation::Node::visit<SQASTWritingVisitor>((Node *)f->_body,this);
  (**this->stream->_vptr_OutputStream)(this->stream,(ulong)f->_vararg);
  (**this->stream->_vptr_OutputStream)(this->stream,(ulong)f->_lambda);
  writeString(this,f->_sourcename);
  return;
}

Assistant:

void SQASTWritingVisitor::visitFunctionDecl(FunctionDecl *f) {
  writeNodeHeader(f);

  writeString(f->name());

  stream->writeUInt64(f->parameters().size());

  for (auto &p : f->parameters()) {
    p->visit(this);
  }

  f->body()->visit(this);
  stream->writeInt8(f->isVararg());
  stream->writeInt8(f->isLambda());

  writeString(f->sourceName());
}